

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

char * cmime_message_generate_message_id(void)

{
  int iVar1;
  int iVar2;
  char *__name;
  size_t sVar3;
  char *__dest;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  __name = (char *)malloc(0x40);
  gethostname(__name,0x40);
  sVar3 = strlen(__name);
  __dest = (char *)malloc(sVar3 + 0x14);
  iVar5 = 0;
  iVar2 = 0;
  do {
    iVar1 = iVar2;
    lVar6 = (long)iVar1 << 0x20;
    lVar7 = 0;
    do {
      lVar6 = lVar6 + 0x100000000;
      iVar2 = cmime_util_rand();
      __dest[lVar7 + iVar1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[iVar2 % 0x24];
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 8);
    bVar8 = iVar5 == 0;
    cVar4 = '@';
    if (bVar8) {
      cVar4 = '.';
    }
    __dest[lVar6 >> 0x20] = cVar4;
    iVar5 = iVar5 + 1;
    iVar2 = iVar1 + 9;
  } while (bVar8);
  __dest[iVar1 + 9] = '\0';
  strcat(__dest,__name);
  free(__name);
  return __dest;
}

Assistant:

char *cmime_message_generate_message_id(void) {
    char *mid = NULL;
    char *hostname = NULL;
    static const char base36[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    int i,i2;
    int pos = 0;

    hostname = (char *)malloc(MAXHOSTNAMELEN);
    gethostname(hostname,MAXHOSTNAMELEN);
        
    mid = (char *)malloc(20 + strlen(hostname));
    for(i=0; i < 2; i++) {
        for (i2=0; i2<8; i2++) 
            mid[pos++] = base36[cmime_util_rand() % 36];
        
        if (i==0)
            mid[pos++] = '.';
        else
            mid[pos++] = '@';
    }
    mid[pos] = '\0';
    strcat(mid,hostname);
    free(hostname);
    return(mid);
}